

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow-c.cpp
# Opt level: O2

void duckdb_destroy_arrow(duckdb_arrow *result)

{
  ArrowResultWrapper *this;
  ArrowResultWrapper *wrapper;
  
  this = (ArrowResultWrapper *)*result;
  if (this != (ArrowResultWrapper *)0x0) {
    duckdb::ArrowResultWrapper::~ArrowResultWrapper(this);
    operator_delete(this);
    *result = (duckdb_arrow)0x0;
  }
  return;
}

Assistant:

void duckdb_destroy_arrow(duckdb_arrow *result) {
	if (*result) {
		auto wrapper = reinterpret_cast<ArrowResultWrapper *>(*result);
		delete wrapper;
		*result = nullptr;
	}
}